

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::NegativeAPINoActiveProgram::Run(NegativeAPINoActiveProgram *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLenum GVar2;
  GLuint GVar3;
  bool *compile_error;
  allocator<char> local_72;
  allocator<char> local_71;
  GLuint buffer;
  GLuint num_group [3];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glDispatchCompute(this_00,1,2,3);
  GVar2 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar2 == 0x502) {
    num_group[0] = 3;
    num_group[1] = 2;
    num_group[2] = 1;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_group,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&buffer);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 == 0x502) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)num_group,
                 "\nlayout(location = 0) in vec4 g_position;\nvoid main() {\n  gl_Position = g_position;\n}"
                 ,&local_71);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,
                 "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(1);\n}",
                 &local_72);
      GVar3 = ComputeShaderBase::CreateProgram
                        (&this->super_ComputeShaderBase,(string *)num_group,(string *)&buffer);
      this->m_program = GVar3;
      std::__cxx11::string::~string((string *)&buffer);
      std::__cxx11::string::~string((string *)num_group);
      glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
      bVar1 = ComputeShaderBase::CheckProgram
                        (&this->super_ComputeShaderBase,this->m_program,compile_error);
      if (!bVar1) {
        return -1;
      }
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,2,3);
      GVar2 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar2 == 0x502) {
        num_group[0] = 3;
        num_group[1] = 2;
        num_group[2] = 1;
        glu::CallLogWrapper::glGenBuffers(this_00,1,&buffer);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_group,0x88e4);
        glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
        glu::CallLogWrapper::glDeleteBuffers(this_00,1,&buffer);
        GVar2 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar2 != 0x502) {
          anon_unknown_0::Output
                    (
                    "INVALID_OPERATION is generated by DispatchCompute or\nDispatchComputeIndirect if there is no active program for the compute\nshader stage.\n"
                    );
        }
        return -(ulong)(GVar2 != 0x502);
      }
      anon_unknown_0::Output
                (
                "INVALID_OPERATION is generated by DispatchCompute or\nDispatchComputeIndirect if there is no active program for the compute\nshader stage.\n"
                );
      return -1;
    }
  }
  anon_unknown_0::Output
            (
            "INVALID_OPERATION is generated by DispatchCompute or\nDispatchComputeIndirect if there is no active program for the compute\nshader stage.\n"
            );
  return -1;
}

Assistant:

virtual long Run()
	{
		glDispatchCompute(1, 2, 3);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION is generated by DispatchCompute or\n"
				   "DispatchComputeIndirect if there is no active program for the compute\n"
				   "shader stage.\n");
			return ERROR;
		}

		/* indirect dispatch */
		{
			GLuint		 buffer;
			const GLuint num_group[3] = { 3, 2, 1 };
			glGenBuffers(1, &buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_group), num_group, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
			glDeleteBuffers(1, &buffer);
			if (glGetError() != GL_INVALID_OPERATION)
			{
				Output("INVALID_OPERATION is generated by DispatchCompute or\n"
					   "DispatchComputeIndirect if there is no active program for the compute\n"
					   "shader stage.\n");
				return ERROR;
			}
		}

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "void main() {" NL "  gl_Position = g_position;" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_color;" NL "void main() {" NL "  g_color = vec4(1);" NL "}";

		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glUseProgram(m_program);

		glDispatchCompute(1, 2, 3);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION is generated by DispatchCompute or\n"
				   "DispatchComputeIndirect if there is no active program for the compute\n"
				   "shader stage.\n");
			return ERROR;
		}

		/* indirect dispatch */
		{
			GLuint		 buffer;
			const GLuint num_group[3] = { 3, 2, 1 };
			glGenBuffers(1, &buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_group), num_group, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
			glDeleteBuffers(1, &buffer);
			if (glGetError() != GL_INVALID_OPERATION)
			{
				Output("INVALID_OPERATION is generated by DispatchCompute or\n"
					   "DispatchComputeIndirect if there is no active program for the compute\n"
					   "shader stage.\n");
				return ERROR;
			}
		}

		return NO_ERROR;
	}